

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::clearSeen(SAT *this)

{
  uint uVar1;
  uint *puVar2;
  bool *pbVar3;
  vec<char> *this_00;
  Lit *pLVar4;
  char *pcVar5;
  long in_RDI;
  uint i_1;
  uint i;
  undefined1 in_stack_ffffffffffffffbf;
  vec<int> *in_stack_ffffffffffffffc0;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = vec<int>::size((vec<int> *)(in_RDI + 0x140));
    if (uVar1 <= local_c) break;
    puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x140),local_c);
    pbVar3 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x130),*puVar2);
    *pbVar3 = false;
    local_c = local_c + 1;
  }
  vec<int>::clear(in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  local_10 = 0;
  while( true ) {
    uVar1 = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x100));
    if (uVar1 <= local_10) break;
    this_00 = (vec<char> *)(in_RDI + 0x120);
    pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_10);
    uVar1 = ::var((Lit)pLVar4->x);
    pcVar5 = vec<char>::operator[](this_00,uVar1);
    *pcVar5 = '\0';
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void SAT::clearSeen() {
	for (unsigned int i = 0; i < ivseen_toclear.size(); i++) {
		ivseen[ivseen_toclear[i]] = false;
	}
	ivseen_toclear.clear();

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		seen[var(out_learnt[i])] = 0;  // ('seen[]' is now cleared)
	}
}